

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O3

PCRE2_SPTR8 get_chr_property_list(PCRE2_SPTR8 code,BOOL utf,uint8_t *fcc,uint32_t *list)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ushort *puVar8;
  ushort *puVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  
  bVar11 = *code;
  uVar3 = (uint)bVar11;
  *list = (uint)bVar11;
  list[1] = 0;
  puVar8 = (ushort *)(code + 1);
  if (0x40 < (byte)(bVar11 - 0x21)) goto LAB_00131528;
  bVar2 = 0x55;
  if ((((bVar11 < 0x55) && (bVar2 = 0x48, bVar11 < 0x48)) && (bVar2 = 0x3b, bVar11 < 0x3b)) &&
     (bVar2 = 0x2e, bVar11 < 0x2e)) {
    bVar2 = 0x21;
  }
  bVar11 = (bVar11 - bVar2) + 0x21;
  if ((bVar11 < 0x2e) && ((0x238000000000U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) {
    puVar8 = (ushort *)(code + 3);
  }
  if ((0x29 < bVar11) || (uVar4 = 0, (0x21800000000U >> ((ulong)bVar11 & 0x3f) & 1) == 0)) {
    uVar4 = (uint32_t)(bVar11 != 0x2b);
  }
  list[1] = uVar4;
  if (bVar2 < 0x3b) {
    uVar4 = 0x1d;
    if (bVar2 == 0x21) {
LAB_0013151a:
      *list = uVar4;
switchD_00131546_caseD_1d:
      puVar9 = (ushort *)((long)puVar8 + 1);
      bVar11 = (byte)*puVar8;
      uVar4 = (uint32_t)bVar11;
      if ((utf != 0) && (0xbf < bVar11)) {
        if ((bVar11 & 0x20) == 0) {
          puVar9 = puVar8 + 1;
          uVar4 = (bVar11 & 0x1f) << 6 | *(byte *)((long)puVar8 + 1) & 0x3f;
        }
        else {
          uVar3 = *(byte *)puVar9 & 0x3f;
          if ((bVar11 & 0x10) == 0) {
            uVar4 = (byte)puVar8[1] & 0x3f | uVar3 << 6 | (uVar4 & 0xf) << 0xc;
            puVar9 = (ushort *)((long)puVar8 + 3);
          }
          else if ((bVar11 & 8) == 0) {
            uVar4 = *(byte *)((long)puVar8 + 3) & 0x3f |
                    ((byte)puVar8[1] & 0x3f) << 6 | uVar3 << 0xc | (uVar4 & 7) << 0x12;
            puVar9 = puVar8 + 2;
          }
          else {
            uVar10 = (byte)puVar8[1] & 0x3f;
            uVar5 = *(byte *)((long)puVar8 + 3) & 0x3f;
            uVar7 = (byte)puVar8[2] & 0x3f;
            if ((bVar11 & 4) == 0) {
              uVar4 = uVar5 << 6 | uVar10 << 0xc | uVar3 << 0x12 | (uVar4 & 3) << 0x18 | uVar7;
              puVar9 = (ushort *)((long)puVar8 + 5);
            }
            else {
              uVar4 = *(byte *)((long)puVar8 + 5) & 0x3f |
                      uVar7 << 6 |
                      uVar5 << 0xc | uVar10 << 0x12 | uVar3 << 0x18 | (uVar4 & 1) << 0x1e;
              puVar9 = puVar8 + 3;
            }
          }
        }
      }
      list[2] = uVar4;
      goto LAB_00131921;
    }
    if (bVar2 != 0x2e) goto LAB_00131528;
  }
  else {
    if (bVar2 == 0x55) {
      uVar3 = (uint)(byte)*puVar8;
      *list = (uint)(byte)*puVar8;
      puVar8 = (ushort *)((long)puVar8 + 1);
LAB_00131528:
      switch(uVar3) {
      case 6:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
        return (PCRE2_SPTR8)puVar8;
      case 0xe:
      case 0x1b:
      case 0x1c:
        return (PCRE2_SPTR8)0x0;
      case 0xf:
      case 0x10:
        if ((byte)*puVar8 != 9) {
          list[2] = (uint)(byte)*puVar8;
          list[3] = (uint)*(byte *)((long)puVar8 + 1);
          return (PCRE2_SPTR8)(puVar8 + 1);
        }
        bVar11 = *(byte *)((long)puVar8 + 1);
        uVar6 = 8;
        do {
          if (0x1f < uVar6) {
            list[2] = (uint)(byte)puVar8[1];
            list[3] = (uint)*(byte *)((long)puVar8 + 3);
            return (PCRE2_SPTR8)(puVar8 + 1);
          }
          iVar1 = *(int *)((long)&_pcre2_utt_size_8 + uVar6 + (ulong)bVar11 * 4);
          *(int *)((long)list + uVar6) = iVar1;
          uVar6 = uVar6 + 4;
        } while (iVar1 != -1);
        *list = (uint)((char)uVar3 != '\x10') * 2 + 0x1d;
        return (PCRE2_SPTR8)(puVar8 + 1);
      case 0x1d:
      case 0x1f:
        goto switchD_00131546_caseD_1d;
      case 0x1e:
        uVar4 = 0x1d;
        goto LAB_00131595;
      case 0x20:
        goto switchD_00131546_caseD_20;
      default:
        if (uVar3 - 0x6e < 2) {
          puVar9 = puVar8 + 0x10;
        }
        else {
          if (uVar3 != 0x70) {
            return (PCRE2_SPTR8)0x0;
          }
          puVar9 = (ushort *)((long)puVar8 + ((ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8) - 1));
        }
        uVar3 = (byte)*puVar9 - 0x62;
        if (uVar3 < 0xc) {
          if ((0x533U >> (uVar3 & 0x1f) & 1) == 0) {
            if ((0x20cU >> (uVar3 & 0x1f) & 1) == 0) {
              list[1] = (uint)((*(ushort *)((long)puVar9 + 1) & 0xff) == 0 &&
                              *(ushort *)((long)puVar9 + 1) >> 8 == 0);
              puVar9 = (ushort *)((long)puVar9 + 5);
              goto LAB_00131797;
            }
          }
          else {
            list[1] = 1;
          }
          puVar9 = (ushort *)((long)puVar9 + 1);
        }
LAB_00131797:
        list[2] = (int)puVar9 - (int)puVar8;
        return (PCRE2_SPTR8)puVar9;
      }
    }
    if (bVar2 != 0x48) {
      if (bVar2 == 0x3b) {
        uVar4 = 0x1f;
        goto LAB_0013151a;
      }
      goto LAB_00131528;
    }
switchD_00131546_caseD_20:
    uVar4 = 0x1f;
  }
LAB_00131595:
  *list = uVar4;
  puVar9 = (ushort *)((long)puVar8 + 1);
  bVar11 = (byte)*puVar8;
  uVar3 = (uint)bVar11;
  if (0xbf < bVar11 && utf != 0) {
    if ((bVar11 & 0x20) == 0) {
      puVar9 = puVar8 + 1;
      uVar3 = (bVar11 & 0x1f) << 6 | *(byte *)((long)puVar8 + 1) & 0x3f;
    }
    else {
      uVar5 = *(byte *)puVar9 & 0x3f;
      if ((bVar11 & 0x10) == 0) {
        uVar3 = (byte)puVar8[1] & 0x3f | uVar5 << 6 | (uVar3 & 0xf) << 0xc;
        puVar9 = (ushort *)((long)puVar8 + 3);
      }
      else if ((bVar11 & 8) == 0) {
        uVar3 = *(byte *)((long)puVar8 + 3) & 0x3f |
                ((byte)puVar8[1] & 0x3f) << 6 | uVar5 << 0xc | (uVar3 & 7) << 0x12;
        puVar9 = puVar8 + 2;
      }
      else {
        uVar12 = (byte)puVar8[1] & 0x3f;
        uVar7 = *(byte *)((long)puVar8 + 3) & 0x3f;
        uVar10 = (byte)puVar8[2] & 0x3f;
        if ((bVar11 & 4) == 0) {
          uVar3 = uVar7 << 6 | uVar12 << 0xc | uVar5 << 0x12 | (uVar3 & 3) << 0x18 | uVar10;
          puVar9 = (ushort *)((long)puVar8 + 5);
        }
        else {
          uVar3 = *(byte *)((long)puVar8 + 5) & 0x3f |
                  uVar10 << 6 | uVar7 << 0xc | uVar12 << 0x12 | uVar5 << 0x18 | (uVar3 & 1) << 0x1e;
          puVar9 = puVar8 + 3;
        }
      }
    }
  }
  list[2] = uVar3;
  if ((uVar3 < 0x80) || (utf == 0 && uVar3 < 0x100)) {
    uVar4 = (uint32_t)fcc[uVar3];
  }
  else {
    uVar4 = _pcre2_ucd_records_8
            [*(ushort *)
              ((long)_pcre2_ucd_stage2_8 +
              (ulong)((uint)""[uVar3 >> 7] * 0x100 + (uVar3 & 0x7f) * 2))].other_case + uVar3;
  }
  list[3] = uVar4;
  if (uVar3 != uVar4) {
    list[4] = 0xffffffff;
    return (PCRE2_SPTR8)puVar9;
  }
LAB_00131921:
  list[3] = 0xffffffff;
  return (PCRE2_SPTR8)puVar9;
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warning */
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }
return NULL;    /* Opcode not accepted */
}